

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Zp_field_operators.h
# Opt level: O1

void __thiscall
Gudhi::persistence_fields::Zp_field_operators<unsigned_int,_void>::multiply_inplace
          (Zp_field_operators<unsigned_int,_void> *this,Element *e1,Element e2)

{
  uint uVar1;
  bool bVar2;
  Element EVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  
  uVar5 = (ulong)e2;
  uVar6 = *e1;
  uVar1 = this->characteristic_;
  if (uVar1 <= uVar6) {
    uVar6 = uVar6 % uVar1;
  }
  if (uVar1 <= e2) {
    uVar5 = uVar5 % (ulong)uVar1;
  }
  EVar3 = 0;
  if (uVar6 != 0) {
    do {
      uVar4 = (uint)uVar5;
      if ((uVar6 & 1) != 0) {
        uVar7 = 0;
        if (uVar1 - EVar3 <= uVar4) {
          uVar7 = uVar1;
        }
        EVar3 = (EVar3 + uVar4) - uVar7;
      }
      uVar7 = 0;
      if (uVar1 - uVar4 <= uVar4) {
        uVar7 = uVar1;
      }
      uVar5 = (ulong)(uVar4 * 2 - uVar7);
      bVar2 = 1 < uVar6;
      uVar6 = uVar6 >> 1;
    } while (bVar2);
  }
  *e1 = EVar3;
  return;
}

Assistant:

void multiply_inplace(Element& e1, Element e2) const {
    e1 = _multiply(get_value(e1), get_value(e2), characteristic_);
  }